

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int define_var(JSParseState *s,JSFunctionDef *fd,JSAtom name,JSVarDefEnum var_def_type)

{
  JSVarDef *pJVar1;
  BOOL BVar2;
  int iVar3;
  JSFunctionDef *fd_00;
  JSContext *pJVar4;
  JSGlobalVar *pJVar5;
  JSVarKindEnum in_ECX;
  JSAtom in_EDX;
  JSFunctionDef *in_RSI;
  JSParseState *in_RDI;
  JSGlobalVar *hf_2;
  JSVarKindEnum var_kind;
  JSGlobalVar *hf_1;
  JSGlobalVar *hf;
  int idx;
  JSVarDef *vd;
  JSContext *ctx;
  JSAtom in_stack_ffffffffffffff9c;
  JSFunctionDef *in_stack_ffffffffffffffa8;
  JSAtom name_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar6;
  JSContext *in_stack_ffffffffffffffb8;
  int local_34;
  
  pJVar4 = in_RDI->ctx;
  fd_00 = (JSFunctionDef *)(ulong)in_ECX;
  name_00 = (JSAtom)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  switch(fd_00) {
  case (JSFunctionDef *)0x0:
    local_34 = add_scope_var((JSContext *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8,0,in_ECX);
    break;
  case (JSFunctionDef *)0x1:
  case (JSFunctionDef *)0x2:
  case (JSFunctionDef *)0x3:
  case (JSFunctionDef *)0x4:
    iVar3 = find_lexical_decl(in_stack_ffffffffffffffb8,
                              (JSFunctionDef *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),name_00,
                              (int)in_stack_ffffffffffffffa8,0);
    if (-1 < iVar3) {
      if (iVar3 < 0x40000000) {
        if (in_RSI->vars[iVar3].scope_level == in_RSI->scope_level) {
          if (((in_RSI->js_mode & 1) != 0) ||
             ((in_ECX != JS_VAR_CATCH || ((*(uint *)&in_RSI->vars[iVar3].field_0xc >> 3 & 0xf) != 1)
              ))) {
LAB_0019195e:
            iVar3 = js_parse_error(in_RDI,"invalid redefinition of lexical identifier");
            return iVar3;
          }
        }
        else if (((*(uint *)&in_RSI->vars[iVar3].field_0xc >> 3 & 0xf) == 3) &&
                (in_RSI->vars[iVar3].scope_level + 2 == in_RSI->scope_level)) goto LAB_0019195e;
      }
      else if (in_RSI->scope_level == in_RSI->body_scope) goto LAB_0019195e;
    }
    if ((((in_ECX != JS_VAR_CATCH) && (in_ECX != JS_VAR_FUNCTION_NAME)) &&
        (in_RSI->scope_level == in_RSI->body_scope)) &&
       (iVar3 = find_arg(pJVar4,in_RSI,in_EDX), -1 < iVar3)) {
      iVar3 = js_parse_error(in_RDI,"invalid redefinition of parameter name");
      return iVar3;
    }
    iVar3 = find_var_in_child_scope
                      (in_stack_ffffffffffffffb8,
                       (JSFunctionDef *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (JSAtom)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                       (int)in_stack_ffffffffffffffa8);
    if (-1 < iVar3) {
      iVar3 = js_parse_error(in_RDI,"invalid redefinition of a variable");
      return iVar3;
    }
    if (((in_RSI->is_global_var != 0) &&
        (pJVar5 = find_global_var(in_RSI,in_EDX), pJVar5 != (JSGlobalVar *)0x0)) &&
       (BVar2 = is_child_scope(pJVar4,in_RSI,pJVar5->scope_level,in_RSI->scope_level), BVar2 != 0))
    {
      iVar3 = js_parse_error(in_RDI,"invalid redefinition of global identifier");
      return iVar3;
    }
    if (((in_RSI->is_eval == 0) || ((in_RSI->eval_type != 0 && (in_RSI->eval_type != 1)))) ||
       (in_RSI->scope_level != in_RSI->body_scope)) {
      if (in_ECX == JS_VAR_CATCH) {
        uVar6 = 1;
      }
      else if (in_ECX == JS_VAR_FUNCTION_NAME) {
        uVar6 = 2;
      }
      else {
        uVar6 = 0;
      }
      local_34 = add_scope_var((JSContext *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8,(JSAtom)((ulong)fd_00 >> 0x20),
                               (JSVarKindEnum)fd_00);
      if (-1 < local_34) {
        pJVar1 = in_RSI->vars;
        *(uint *)&pJVar1[local_34].field_0xc = *(uint *)&pJVar1[local_34].field_0xc & 0xfffffffd | 2
        ;
        *(uint *)&pJVar1[local_34].field_0xc =
             *(uint *)&pJVar1[local_34].field_0xc & 0xfffffffe |
             (uint)(in_ECX == JS_VAR_NEW_FUNCTION_DECL);
      }
    }
    else {
      pJVar5 = add_global_var((JSContext *)in_stack_ffffffffffffffa8,fd_00,in_stack_ffffffffffffff9c
                             );
      if (pJVar5 == (JSGlobalVar *)0x0) {
        return -1;
      }
      pJVar5->field_0x4 = pJVar5->field_0x4 & 0xfd | 2;
      pJVar5->field_0x4 = pJVar5->field_0x4 & 0xfb | (in_ECX == JS_VAR_NEW_FUNCTION_DECL) << 2;
      local_34 = 0x40000000;
    }
    break;
  case (JSFunctionDef *)0x5:
    local_34 = add_scope_var((JSContext *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8,0,in_ECX);
    break;
  case (JSFunctionDef *)0x6:
    iVar3 = find_lexical_decl(in_stack_ffffffffffffffb8,
                              (JSFunctionDef *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),name_00,
                              (int)in_stack_ffffffffffffffa8,0);
    if (-1 < iVar3) {
LAB_00191c27:
      iVar3 = js_parse_error(in_RDI,"invalid redefinition of lexical identifier");
      return iVar3;
    }
    if (in_RSI->is_global_var == 0) {
      local_34 = find_var((JSContext *)in_stack_ffffffffffffffa8,fd_00,in_stack_ffffffffffffff9c);
      if ((local_34 < 0) &&
         (local_34 = add_var(in_stack_ffffffffffffffb8,
                             (JSFunctionDef *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (JSAtom)((ulong)in_stack_ffffffffffffffa8 >> 0x20)), -1 < local_34)) {
        if ((in_EDX == 0x4d) && (in_RSI->has_arguments_binding != 0)) {
          in_RSI->arguments_var_idx = local_34;
        }
        in_RSI->vars[local_34].scope_next = in_RSI->scope_level;
      }
    }
    else {
      pJVar4 = (JSContext *)find_global_var(in_RSI,in_EDX);
      if ((((pJVar4 != (JSContext *)0x0) && (((byte)(pJVar4->header).field_0x4 >> 1 & 1) != 0)) &&
          (*(int *)&(pJVar4->header).link.prev == in_RSI->scope_level)) && (in_RSI->eval_type == 1))
      goto LAB_00191c27;
      pJVar5 = add_global_var(pJVar4,fd_00,in_stack_ffffffffffffff9c);
      if (pJVar5 == (JSGlobalVar *)0x0) {
        return -1;
      }
      local_34 = 0x40000000;
    }
    break;
  default:
    abort();
  }
  return local_34;
}

Assistant:

static int define_var(JSParseState *s, JSFunctionDef *fd, JSAtom name,
                      JSVarDefEnum var_def_type)
{
    JSContext *ctx = s->ctx;
    JSVarDef *vd;
    int idx;

    switch (var_def_type) {
    case JS_VAR_DEF_WITH:
        idx = add_scope_var(ctx, fd, name, JS_VAR_NORMAL);
        break;

    case JS_VAR_DEF_LET:
    case JS_VAR_DEF_CONST:
    case JS_VAR_DEF_FUNCTION_DECL:
    case JS_VAR_DEF_NEW_FUNCTION_DECL:
        idx = find_lexical_decl(ctx, fd, name, fd->scope_first, TRUE);
        if (idx >= 0) {
            if (idx < GLOBAL_VAR_OFFSET) {
                if (fd->vars[idx].scope_level == fd->scope_level) {
                    /* same scope: in non strict mode, functions
                       can be redefined (annex B.3.3.4). */
                    if (!(!(fd->js_mode & JS_MODE_STRICT) &&
                          var_def_type == JS_VAR_DEF_FUNCTION_DECL &&
                          fd->vars[idx].var_kind == JS_VAR_FUNCTION_DECL)) {
                        goto redef_lex_error;
                    }
                } else if (fd->vars[idx].var_kind == JS_VAR_CATCH && (fd->vars[idx].scope_level + 2) == fd->scope_level) {
                    goto redef_lex_error;
                }
            } else {
                if (fd->scope_level == fd->body_scope) {
                redef_lex_error:
                    /* redefining a scoped var in the same scope: error */
                    return js_parse_error(s, "invalid redefinition of lexical identifier");
                }
            }
        }
        if (var_def_type != JS_VAR_DEF_FUNCTION_DECL &&
            var_def_type != JS_VAR_DEF_NEW_FUNCTION_DECL &&
            fd->scope_level == fd->body_scope &&
            find_arg(ctx, fd, name) >= 0) {
            /* lexical variable redefines a parameter name */
            return js_parse_error(s, "invalid redefinition of parameter name");
        }

        if (find_var_in_child_scope(ctx, fd, name, fd->scope_level) >= 0) {
            return js_parse_error(s, "invalid redefinition of a variable");
        }
        
        if (fd->is_global_var) {
            JSGlobalVar *hf;
            hf = find_global_var(fd, name);
            if (hf && is_child_scope(ctx, fd, hf->scope_level,
                                     fd->scope_level)) {
                return js_parse_error(s, "invalid redefinition of global identifier");
            }
        }
        
        if (fd->is_eval &&
            (fd->eval_type == JS_EVAL_TYPE_GLOBAL ||
             fd->eval_type == JS_EVAL_TYPE_MODULE) &&
            fd->scope_level == fd->body_scope) {
            JSGlobalVar *hf;
            hf = add_global_var(s->ctx, fd, name);
            if (!hf)
                return -1;
            hf->is_lexical = TRUE;
            hf->is_const = (var_def_type == JS_VAR_DEF_CONST);
            idx = GLOBAL_VAR_OFFSET;
        } else {
            JSVarKindEnum var_kind;
            if (var_def_type == JS_VAR_DEF_FUNCTION_DECL)
                var_kind = JS_VAR_FUNCTION_DECL;
            else if (var_def_type == JS_VAR_DEF_NEW_FUNCTION_DECL)
                var_kind = JS_VAR_NEW_FUNCTION_DECL;
            else
                var_kind = JS_VAR_NORMAL;
            idx = add_scope_var(ctx, fd, name, var_kind);
            if (idx >= 0) {
                vd = &fd->vars[idx];
                vd->is_lexical = 1;
                vd->is_const = (var_def_type == JS_VAR_DEF_CONST);
            }
        }
        break;

    case JS_VAR_DEF_CATCH:
        idx = add_scope_var(ctx, fd, name, JS_VAR_CATCH);
        break;

    case JS_VAR_DEF_VAR:
        if (find_lexical_decl(ctx, fd, name, fd->scope_first,
                              FALSE) >= 0) {
       invalid_lexical_redefinition:
            /* error to redefine a var that inside a lexical scope */
            return js_parse_error(s, "invalid redefinition of lexical identifier");
        }
        if (fd->is_global_var) {
            JSGlobalVar *hf;
            hf = find_global_var(fd, name);
            if (hf && hf->is_lexical && hf->scope_level == fd->scope_level &&
                fd->eval_type == JS_EVAL_TYPE_MODULE) {
                goto invalid_lexical_redefinition;
            }
            hf = add_global_var(s->ctx, fd, name);
            if (!hf)
                return -1;
            idx = GLOBAL_VAR_OFFSET;
        } else {
            /* if the variable already exists, don't add it again  */
            idx = find_var(ctx, fd, name);
            if (idx >= 0)
                break;
            idx = add_var(ctx, fd, name);
            if (idx >= 0) {
                if (name == JS_ATOM_arguments && fd->has_arguments_binding)
                    fd->arguments_var_idx = idx;
                fd->vars[idx].scope_next = fd->scope_level;
            }
        }
        break;
    default:
        abort();
    }
    return idx;
}